

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int renameTableExprCb(Walker *pWalker,Expr *pExpr)

{
  RenameCtx *pRVar1;
  RenameToken *pToken;
  RenameToken *pRVar2;
  RenameToken *pRVar3;
  RenameToken **ppRVar4;
  
  if ((pExpr->op == 0xa2) && (pRVar1 = (pWalker->u).pRename, pRVar1->pTab == (pExpr->y).pTab)) {
    pRVar3 = pWalker->pParse->pRename;
    if (pRVar3 != (RenameToken *)0x0) {
      if ((anon_union_8_3_c79b3df9_for_y *)pRVar3->p == &pExpr->y) {
        ppRVar4 = &pWalker->pParse->pRename;
      }
      else {
        do {
          pRVar2 = pRVar3;
          pRVar3 = pRVar2->pNext;
          if (pRVar3 == (RenameToken *)0x0) {
            return 0;
          }
        } while ((anon_union_8_3_c79b3df9_for_y *)pRVar3->p != &pExpr->y);
        ppRVar4 = &pRVar2->pNext;
      }
      *ppRVar4 = pRVar3->pNext;
      pRVar3->pNext = pRVar1->pList;
      pRVar1->pList = pRVar3;
      pRVar1->nList = pRVar1->nList + 1;
    }
  }
  return 0;
}

Assistant:

static int renameTableExprCb(Walker *pWalker, Expr *pExpr){
  RenameCtx *p = pWalker->u.pRename;
  if( pExpr->op==TK_COLUMN && p->pTab==pExpr->y.pTab ){
    renameTokenFind(pWalker->pParse, p, (void*)&pExpr->y.pTab);
  }
  return WRC_Continue;
}